

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idct.c
# Opt level: O0

void av1_inverse_transform_block
               (MACROBLOCKD *xd,tran_low_t *dqcoeff,int plane,TX_TYPE tx_type,TX_SIZE tx_size,
               uint8_t *dst,int stride,int eob,int reduced_tx_set)

{
  tran_low_t *in_RSI;
  TxfmParam *in_R9;
  int in_stack_00000008;
  TxfmParam txfm_param;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  TX_TYPE in_stack_ffffffffffffffca;
  TX_SIZE in_stack_ffffffffffffffcb;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  
  if (txfm_param._0_4_ != 0) {
    init_txfm_param((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffcc,in_stack_ffffffffffffffcb,in_stack_ffffffffffffffca,
                    in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_R9);
    if (in_stack_ffffffffffffffd4 == 0) {
      (*av1_inv_txfm_add)(in_RSI,&in_R9->tx_type,in_stack_00000008,
                          (TxfmParam *)&stack0xffffffffffffffc8);
    }
    else {
      (*av1_highbd_inv_txfm_add)
                (in_RSI,&in_R9->tx_type,in_stack_00000008,(TxfmParam *)&stack0xffffffffffffffc8);
    }
  }
  return;
}

Assistant:

void av1_inverse_transform_block(const MACROBLOCKD *xd,
                                 const tran_low_t *dqcoeff, int plane,
                                 TX_TYPE tx_type, TX_SIZE tx_size, uint8_t *dst,
                                 int stride, int eob, int reduced_tx_set) {
  if (!eob) return;

  assert(eob <= av1_get_max_eob(tx_size));

  TxfmParam txfm_param;
  init_txfm_param(xd, plane, tx_size, tx_type, eob, reduced_tx_set,
                  &txfm_param);
  assert(av1_ext_tx_used[txfm_param.tx_set_type][txfm_param.tx_type]);

  if (txfm_param.is_hbd) {
    av1_highbd_inv_txfm_add(dqcoeff, dst, stride, &txfm_param);
  } else {
    av1_inv_txfm_add(dqcoeff, dst, stride, &txfm_param);
  }
}